

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void row_numberValueFunc(sqlite3_context *pCtx)

{
  undefined8 *puVar1;
  i64 *p;
  sqlite3_context *in_stack_ffffffffffffffd8;
  sqlite3_context *pCtx_00;
  
  puVar1 = (undefined8 *)sqlite3_aggregate_context(in_stack_ffffffffffffffd8,0);
  if (puVar1 == (undefined8 *)0x0) {
    pCtx_00 = (sqlite3_context *)0x0;
  }
  else {
    pCtx_00 = (sqlite3_context *)*puVar1;
  }
  sqlite3_result_int64(pCtx_00,(i64)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void row_numberValueFunc(sqlite3_context *pCtx){
  i64 *p = (i64*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  sqlite3_result_int64(pCtx, (p ? *p : 0));
}